

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
either<toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>,_toml::detail::sequence<toml::detail::character<'\\'>,_toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>,_toml::detail::repeat<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>,_toml::detail::unlimited>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_68;
  
  either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>
  ::invoke(&local_68,loc);
  if (local_68.is_ok_ == true) {
    __return_storage_ptr__->is_ok_ = true;
    region::region(&(__return_storage_ptr__->field_1).succ.value,&local_68.field_1.succ.value);
  }
  else {
    sequence<toml::detail::character<'\\'>,_toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>,_toml::detail::repeat<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>,_toml::detail::unlimited>_>
    ::invoke(__return_storage_ptr__,loc);
  }
  if (local_68.is_ok_ == true) {
    region::~region(&local_68.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }